

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O1

void __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::adjustCursor
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QPoint *pos)

{
  int **this_00;
  undefined1 auVar1 [8];
  compare_eq_result_container<QList<int>,_int> cVar2;
  bool bVar3;
  QWidget *this_01;
  long in_FS_OFFSET;
  QCursor moved;
  undefined1 local_60 [8];
  QRect local_58;
  undefined1 local_48 [16];
  QCursor local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = QLayout::parentWidget((QLayout *)&this[-1].movingSeparator.d.size);
  this->hoverPos = *pos;
  if ((pos->yp).m_i == 0 && (pos->xp).m_i == 0) {
    if ((this->hoverSeparator).d.size != 0) {
      local_48 = (undefined1  [16])
                 QDockAreaLayoutInfo::separatorRect
                           ((QDockAreaLayoutInfo *)&this[1].hoverSeparator.d.ptr,
                            &this->hoverSeparator);
      QWidget::update(this_01,(QRect *)local_48);
    }
    QList<int>::clear(&this->hoverSeparator);
    if (this->cursorAdjusted == true) {
      this->cursorAdjusted = false;
      if (this->hasOldCursor == true) {
        QWidget::setCursor(this_01,&this->oldCursor);
      }
      else {
        QWidget::unsetCursor(this_01);
      }
    }
  }
  else if ((this->movingSeparator).d.size == 0) {
    this_00 = &this[1].hoverSeparator.d.ptr;
    local_38.d = (QCursorData *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayoutInfo::findSeparator((QList<int> *)local_48,(QDockAreaLayoutInfo *)this_00,pos);
    cVar2 = QList<int>::operator==((QList<int> *)local_48,&this->hoverSeparator);
    if (!cVar2) {
      if ((this->hoverSeparator).d.size != 0) {
        local_58 = QDockAreaLayoutInfo::separatorRect
                             ((QDockAreaLayoutInfo *)this_00,&this->hoverSeparator);
        QWidget::update(this_01,&local_58);
      }
      QArrayDataPointer<int>::operator=
                ((QArrayDataPointer<int> *)this,(QArrayDataPointer<int> *)local_48);
      if ((this->hoverSeparator).d.size == 0) {
        if (this->cursorAdjusted == true) {
          this->cursorAdjusted = false;
          if (this->hasOldCursor == true) {
            QWidget::setCursor(this_01,&this->oldCursor);
          }
          else {
            QWidget::unsetCursor(this_01);
          }
        }
      }
      else {
        local_58 = QDockAreaLayoutInfo::separatorRect
                             ((QDockAreaLayoutInfo *)this_00,&this->hoverSeparator);
        QWidget::update(this_01,&local_58);
        if (this->cursorAdjusted == false) {
          QWidget::cursor((QWidget *)local_60);
          auVar1 = local_60;
          local_60 = (undefined1  [8])0x0;
          local_58._0_8_ = (this->oldCursor).d;
          (this->oldCursor).d = (QCursorData *)auVar1;
          QCursor::~QCursor((QCursor *)&local_58);
          QCursor::~QCursor((QCursor *)local_60);
          bVar3 = QWidget::testAttribute_helper(this_01,WA_SetCursor);
          this->hasOldCursor = bVar3;
        }
        separatorCursor((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)local_60,
                        &this->hoverSeparator);
        auVar1 = local_60;
        local_60 = (undefined1  [8])0x0;
        local_58._0_8_ = (this->adjustedCursor).d;
        (this->adjustedCursor).d = (QCursorData *)auVar1;
        QCursor::~QCursor((QCursor *)&local_58);
        QCursor::~QCursor((QCursor *)local_60);
        QWidget::setCursor(this_01,&this->adjustedCursor);
        this->cursorAdjusted = true;
      }
    }
    if ((QPoint)local_48._0_8_ != (QPoint)0x0) {
      LOCK();
      *(int *)local_48._0_8_ = *(int *)local_48._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_48._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_48._0_8_,4,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutSeparatorHelper<Layout>::adjustCursor(const QPoint &pos)
{
    QWidget *w = layout()->window();
    hoverPos = pos;

    if (pos == QPoint(0, 0)) {
        if (!hoverSeparator.isEmpty())
            w->update(layout()->dockAreaLayoutInfo()->separatorRect(hoverSeparator));
        hoverSeparator.clear();

        if (cursorAdjusted) {
            cursorAdjusted = false;
            if (hasOldCursor)
                w->setCursor(oldCursor);
            else
                w->unsetCursor();
        }
    } else if (movingSeparator.isEmpty()) { // Don't change cursor when moving separator
        QList<int> pathToSeparator = findSeparator(pos);

        if (pathToSeparator != hoverSeparator) {
            if (!hoverSeparator.isEmpty())
                w->update(layout()->dockAreaLayoutInfo()->separatorRect(hoverSeparator));

            hoverSeparator = pathToSeparator;

            if (hoverSeparator.isEmpty()) {
                if (cursorAdjusted) {
                    cursorAdjusted = false;
                    if (hasOldCursor)
                        w->setCursor(oldCursor);
                    else
                        w->unsetCursor();
                }
            } else {
                w->update(layout()->dockAreaLayoutInfo()->separatorRect(hoverSeparator));
                if (!cursorAdjusted) {
                    oldCursor = w->cursor();
                    hasOldCursor = w->testAttribute(Qt::WA_SetCursor);
                }
                adjustedCursor = separatorCursor(hoverSeparator);
                w->setCursor(adjustedCursor);
                cursorAdjusted = true;
            }
        }
    }
}